

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::TestErrorHandler::handleApplicationError
          (TestErrorHandler *this,Exception *exception,Maybe<kj::HttpService::Response_&> *response)

{
  Response *pRVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 *in_RCX;
  StringPtr statusText;
  String local_58;
  ArrayPtr<const_char> local_38;
  char *local_28;
  undefined8 local_20;
  
  pRVar1 = response[6].ptr;
  if (pRVar1 == (Response *)0x0) {
    local_38.ptr = "";
  }
  else {
    local_38.ptr = (char *)response[5].ptr;
  }
  local_38.size_ = (long)pRVar1 + ((ulong)(pRVar1 == (Response *)0x0) - 1);
  local_28 = "Saw application error: ";
  local_20 = 0x17;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (&local_58,(_ *)&local_28,&local_38,(ArrayPtr<const_char> *)local_38.ptr);
  statusText.content.size_ = 0x16;
  statusText.content.ptr = "Internal Server Error";
  sendError(this,500,statusText,&local_58,(Response *)*in_RCX);
  sVar3 = local_58.content.size_;
  pcVar2 = local_58.content.ptr;
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    (**(local_58.content.disposer)->_vptr_ArrayDisposer)
              (local_58.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleApplicationError(
      kj::Exception exception, kj::Maybe<kj::HttpService::Response&> response) override {
    return sendError(500, "Internal Server Error",
        kj::str("Saw application error: ", exception.getDescription()), response);
  }